

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::Combo(char *label,int *current_item,_func_bool_void_ptr_int_char_ptr_ptr *items_getter,
                 void *data,int items_count,int popup_max_height_in_items)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  void *ptr_id;
  float fVar8;
  char *item_text;
  char *preview_text;
  char *local_48;
  char *local_40;
  ImVec2 local_38;
  
  pIVar4 = GImGui;
  local_40 = (char *)0x0;
  iVar2 = *current_item;
  if (iVar2 < items_count && -1 < iVar2) {
    (*items_getter)(data,iVar2,&local_40);
  }
  pIVar5 = GImGui;
  if ((popup_max_height_in_items != -1) && ((pIVar4->NextWindowData).SizeConstraintCond == 0)) {
    if (popup_max_height_in_items < 1) {
      fVar8 = 3.4028235e+38;
    }
    else {
      fVar8 = (GImGui->Style).WindowPadding.y;
      fVar1 = (GImGui->Style).ItemSpacing.y;
      fVar8 = fVar8 + fVar8 +
              ((float)popup_max_height_in_items * (GImGui->FontSize + fVar1) - fVar1);
    }
    (GImGui->NextWindowData).SizeConstraintCond = 1;
    (pIVar5->NextWindowData).SizeConstraintRect.Min.x = 0.0;
    (pIVar5->NextWindowData).SizeConstraintRect.Min.y = 0.0;
    (pIVar5->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar5->NextWindowData).SizeConstraintRect.Max.y = fVar8;
    (pIVar5->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar5->NextWindowData).SizeCallbackUserData = (void *)0x0;
  }
  bVar7 = false;
  bVar6 = BeginCombo(label,local_40,0);
  if (bVar6) {
    if (items_count < 1) {
      bVar7 = false;
    }
    else {
      ptr_id = (void *)0x0;
      bVar7 = false;
      do {
        PushID(ptr_id);
        uVar3 = *current_item;
        bVar6 = (*items_getter)(data,(int)ptr_id,&local_48);
        if (!bVar6) {
          local_48 = "*Unknown item*";
        }
        local_38.x = 0.0;
        local_38.y = 0.0;
        bVar6 = Selectable(local_48,ptr_id == (void *)(ulong)uVar3,0,&local_38);
        if (bVar6) {
          *current_item = (int)ptr_id;
          bVar7 = true;
        }
        if (ptr_id == (void *)(ulong)uVar3) {
          SetItemDefaultFocus();
        }
        PopID();
        ptr_id = (void *)((long)ptr_id + 1);
      } while ((void *)(ulong)(uint)items_count != ptr_id);
    }
    EndPopup();
  }
  return bVar7;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, bool (*items_getter)(void*, int, const char**), void* data, int items_count, int popup_max_height_in_items)
{
    ImGuiContext& g = *GImGui;

    const char* preview_text = NULL;
    if (*current_item >= 0 && *current_item < items_count)
        items_getter(data, *current_item, &preview_text);

    // The old Combo() API exposed "popup_max_height_in_items". The new more general BeginCombo() API doesn't, so we emulate it here.
    if (popup_max_height_in_items != -1 && !g.NextWindowData.SizeConstraintCond)
    {
        float popup_max_height = CalcMaxPopupHeightFromItemCount(popup_max_height_in_items);
        SetNextWindowSizeConstraints(ImVec2(0,0), ImVec2(FLT_MAX, popup_max_height));
    }

    if (!BeginCombo(label, preview_text, 0))
        return false;

    // Display items
    // FIXME-OPT: Use clipper (but we need to disable it on the appearing frame to make sure our call to SetItemDefaultFocus() is processed)
    bool value_changed = false;
    for (int i = 0; i < items_count; i++)
    {
        PushID((void*)(intptr_t)i);
        const bool item_selected = (i == *current_item);
        const char* item_text;
        if (!items_getter(data, i, &item_text))
            item_text = "*Unknown item*";
        if (Selectable(item_text, item_selected))
        {
            value_changed = true;
            *current_item = i;
        }
        if (item_selected)
            SetItemDefaultFocus();
        PopID();
    }

    EndCombo();
    return value_changed;
}